

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O1

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on<bool>
          (reporter<boost::ext::ut::v1_1_8::printer> *this,assertion_fail<bool> assertion)

{
  undefined1 *this_00;
  size_t *psVar1;
  uint *puVar2;
  uchar *tbs;
  uchar *puVar3;
  uchar *puVar4;
  size_t siglen;
  char *pcVar5;
  char *contents;
  size_t in_R8;
  string sStack_68;
  reporter<boost::ext::ut::v1_1_8::printer> *prStack_48;
  undefined1 *puStack_40;
  char local_2b [3];
  
  this_00 = &(this->printer_).field_0x40;
  puStack_40 = (undefined1 *)0x10aab1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n  ",3);
  puStack_40 = (undefined1 *)0x10aabe;
  tbs = (uchar *)strlen(assertion.location.file_);
  puVar3 = tbs;
  if (tbs != (uchar *)0x0) {
    do {
      if (puVar3 == (uchar *)0x0) goto LAB_0010ab10;
      pcVar5 = assertion.location.file_ + -1 + (long)puVar3;
      puVar3 = puVar3 + -1;
    } while (*pcVar5 != '/');
    if (tbs == (uchar *)0x0) {
LAB_0010ab02:
      puVar4 = (uchar *)0x0;
    }
    else {
      puVar3 = tbs + 1;
      do {
        if (puVar3 == (uchar *)0x1) goto LAB_0010ab02;
        puVar4 = puVar3 + -1;
        pcVar5 = assertion.location.file_ + -2 + (long)puVar3;
        puVar3 = puVar4;
      } while (*pcVar5 != '/');
    }
    if (tbs < puVar4) {
      contents = "%s: __pos (which is %zu) > __size (which is %zu)";
      pcVar5 = "basic_string_view::substr";
      puStack_40 = (undefined1 *)0x10ac0d;
      std::__throw_out_of_range_fmt("%s: __pos (which is %zu) > __size (which is %zu)");
      prStack_48 = this;
      puStack_40 = this_00;
      ApprovalTests::StringMaker::toString<int>(&sStack_68,(int *)contents);
      ApprovalTests::
      TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::verify
                ((EVP_PKEY_CTX *)&sStack_68,(uchar *)pcVar5,siglen,tbs,in_R8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_68._M_dataplus._M_p != &sStack_68.field_2) {
        operator_delete(sStack_68._M_dataplus._M_p,sStack_68.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    assertion.location.file_ = assertion.location.file_ + (long)puVar4;
    tbs = tbs + -(long)puVar4;
  }
LAB_0010ab10:
  puStack_40 = (undefined1 *)0x10ab23;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,assertion.location.file_,(long)tbs);
  local_2b[0] = ':';
  puStack_40 = (undefined1 *)0x10ab3b;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_2b,1);
  puStack_40 = (undefined1 *)0x10ab48;
  std::ostream::operator<<(this_00,assertion.location.line_);
  local_2b[1] = 0x3a;
  puStack_40 = (undefined1 *)0x10ab5d;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_2b + 1,1);
  puStack_40 = (undefined1 *)0x10ab6d;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->printer_).colors_.fail._M_str,
             (this->printer_).colors_.fail._M_len);
  puStack_40 = (undefined1 *)0x10ab81;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"FAILED",6);
  puStack_40 = (undefined1 *)0x10ab91;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->printer_).colors_.none._M_str,
             (this->printer_).colors_.none._M_len);
  puStack_40 = (undefined1 *)0x10aba5;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," [",2);
  puVar2 = (uint *)(&(this->printer_).field_0x58 +
                   *(long *)(*(long *)&(this->printer_).field_0x40 + -0x18));
  *puVar2 = *puVar2 | 1;
  puStack_40 = (undefined1 *)0x10abc2;
  std::ostream::_M_insert<bool>(SUB81(this_00,0));
  puStack_40 = (undefined1 *)0x10abd2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->printer_).colors_.none._M_str,
             (this->printer_).colors_.none._M_len);
  local_2b[2] = 0x5d;
  puStack_40 = (undefined1 *)0x10abe7;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_2b + 2,1);
  psVar1 = &(this->asserts_).fail;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

auto on(events::assertion_fail<TExpr> assertion) -> void {
      constexpr auto short_name = [](std::string_view name) {
        return name.rfind('/') != std::string_view::npos
                   ? name.substr(name.rfind('/') + 1)
                   : name;
      };
      printer_ << "\n  " << short_name(assertion.location.file_name()) << ':'
               << assertion.location.line() << ':' << printer_.colors().fail
               << "FAILED" << printer_.colors().none << " [" << std::boolalpha
               << assertion.expr << printer_.colors().none << ']';
      ++asserts_.fail;
    }